

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

void __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this)

{
  size_t sVar1;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  
  if (in_RDI->m_hdr != (BufHdr *)0x0) {
    sVar1 = rc::RefCount::getRefCount(&in_RDI->m_hdr->super_RefCount);
    if (sVar1 == 1) {
      in_RDI->m_p = (C *)(in_RDI->m_hdr + 1);
      *in_RDI->m_p = '\0';
      in_RDI->m_length = 0;
    }
    else {
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(in_RDI);
    }
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_hdr) {
			ASSERT(!this->m_length);
			return;
		}

		if (this->m_hdr->getRefCount() != 1) {
			this->release();
			return;
		}

		this->m_p = (C*)(this->m_hdr + 1);
		this->m_p[0] = 0;
		this->m_length = 0;
	}